

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_manager.cpp
# Opt level: O1

void __thiscall
pcplusplus::thread_manager::run_threads
          (thread_manager *this,size_t num_producers,size_t num_consumers,size_t buffer_capacity,
          size_t target)

{
  bool bVar1;
  queue<long> *this_00;
  producer_threads *this_01;
  consumer_threads *this_02;
  ostream *poVar2;
  long *plVar3;
  condition_variable canConsume;
  condition_variable canProduce;
  mutex mtx;
  condition_variable local_b8 [48];
  condition_variable local_88 [48];
  __native_type local_58;
  
  this_00 = (queue<long> *)operator_new(0x28);
  queue<long>::queue(this_00,buffer_capacity);
  local_58.__align = 0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_58.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(local_88);
  std::condition_variable::condition_variable(local_b8);
  this_01 = (producer_threads *)operator_new(0x288);
  threads::producer_threads::producer_threads
            (this_01,target,num_producers,(mutex *)&local_58.__data,local_88,local_b8,this_00);
  this_02 = (consumer_threads *)operator_new(0x288);
  threads::consumer_threads::consumer_threads
            (this_02,target,num_consumers,(mutex *)&local_58.__data,local_b8,local_88,this_00);
  (*(this_01->super_generic_threads)._vptr_generic_threads[3])(this_01);
  (*(this_02->super_generic_threads)._vptr_generic_threads[3])(this_02);
  (*(this_01->super_generic_threads)._vptr_generic_threads[4])(this_01);
  (*(this_02->super_generic_threads)._vptr_generic_threads[4])(this_02);
  bVar1 = (bool)std::__basic_file<char>::is_open();
  this->last_producer_log_status = bVar1;
  (*(this_01->super_generic_threads)._vptr_generic_threads[2])(this_01);
  bVar1 = (bool)std::__basic_file<char>::is_open();
  this->last_consumer_log_status = bVar1;
  (*(this_02->super_generic_threads)._vptr_generic_threads[2])(this_02);
  queue<long>::~queue(this_00);
  operator_delete(this_00,0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"All threads finished.",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Produced: ",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Consumed: ",10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::condition_variable::~condition_variable(local_b8);
  std::condition_variable::~condition_variable(local_88);
  return;
}

Assistant:

void thread_manager::run_threads(std::size_t num_producers, std::size_t num_consumers, std::size_t buffer_capacity, std::size_t target){
	queue<long> *buffer;
	try{
            buffer = new queue<long>(buffer_capacity);
        }
        catch(const std::bad_alloc& e){
	    std::cerr << "Failed to initialize buffer" << std::endl;
	    std::exit(EXIT_FAILURE);
        }
	std::mutex mtx;
	std::condition_variable canProduce, canConsume;
	threads::generic_threads *producers, *consumers;
	try{
	    producers = new threads::producer_threads(target, num_producers, &mtx, &canProduce, &canConsume, buffer);
	}
	catch(const std::bad_alloc& e){
	    std::cerr << "Failed to allocate memory for producer threads." << std::endl;
	    std::exit(EXIT_FAILURE);
	}

	try{
	    consumers = new threads::consumer_threads(target, num_consumers, &mtx, &canConsume, &canProduce, buffer);
	}
	catch(const std::bad_alloc& e){
	    std::cerr << "Failed to allocate memory for consumer threads." << std::endl;
	    std::exit(EXIT_FAILURE);
	}
	
	size_t num_produced, num_consumed;
	try{
	    producers->fork();
	    consumers->fork();
	    num_produced = producers->join();
	    num_consumed = consumers->join();
	}
	catch(const exceptions::thread_failure& e){
	    std::cerr << e.what() << std::endl;
	    std::exit(EXIT_FAILURE);
	}
	
	last_producer_log_status = producers->logfile_is_open();
	delete producers;

	last_consumer_log_status = consumers->logfile_is_open();
	delete consumers;

	delete buffer;

	std::cout << "All threads finished." << std::endl;
	std::cout << "Produced: " << num_produced << std::endl << "Consumed: " << num_consumed << std::endl << std::endl;
    }